

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader_preprocessor.c
# Opt level: O2

Define * find_define(Context_conflict1 *ctx,char *sym)

{
  Define *pDVar1;
  IncludeState *pIVar2;
  byte bVar3;
  uint8 uVar4;
  int iVar5;
  uint uVar6;
  size_t __n;
  char *pcVar7;
  char *pcVar8;
  Define **ppDVar9;
  
  bVar3 = hash_define(sym);
  ppDVar9 = ctx->define_hashtable + bVar3;
  while (pDVar1 = *ppDVar9, pDVar1 != (Define *)0x0) {
    iVar5 = strcmp(pDVar1->identifier,sym);
    if (iVar5 == 0) {
      return pDVar1;
    }
    ppDVar9 = &pDVar1->next;
  }
  uVar4 = hash_define("__FILE__");
  if (uVar4 != 'C') {
    __assert_fail("hash_define(\"__FILE__\") == filestrhash",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader_preprocessor.c"
                  ,0x1bc,"const Define *find_define(Context *, const char *)");
  }
  uVar4 = hash_define("__LINE__");
  if (uVar4 != 'K') {
    __assert_fail("hash_define(\"__LINE__\") == linestrhash",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader_preprocessor.c"
                  ,0x1bf,"const Define *find_define(Context *, const char *)");
  }
  if (bVar3 == 0x4b) {
    pDVar1 = ctx->line_macro;
    if (pDVar1 == (Define *)0x0) {
      return (Define *)0x0;
    }
    iVar5 = strcmp(sym,"__LINE__");
    if (iVar5 != 0) {
      return (Define *)0x0;
    }
    (*ctx->free)(pDVar1->definition,ctx->malloc_data);
    pIVar2 = ctx->include_stack;
    pcVar8 = (char *)(*ctx->malloc)(0x20,ctx->malloc_data);
    if (pcVar8 != (char *)0x0) {
      uVar6 = snprintf(pcVar8,0x20,"%u",(ulong)pIVar2->line);
      if (0x1f < uVar6) {
        __assert_fail("len < bufsize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader_preprocessor.c"
                      ,0x1db,"const Define *find_define(Context *, const char *)");
      }
      pDVar1 = ctx->line_macro;
      pDVar1->definition = pcVar8;
      return pDVar1;
    }
  }
  else {
    if (bVar3 != 0x43) {
      return (Define *)0x0;
    }
    pDVar1 = ctx->file_macro;
    if (pDVar1 == (Define *)0x0) {
      return (Define *)0x0;
    }
    iVar5 = strcmp(sym,"__FILE__");
    if (iVar5 != 0) {
      return (Define *)0x0;
    }
    (*ctx->free)(pDVar1->definition,ctx->malloc_data);
    if (ctx->include_stack == (IncludeState *)0x0) {
      pcVar8 = "";
    }
    else {
      pcVar8 = ctx->include_stack->filename;
    }
    __n = strlen(pcVar8);
    pcVar7 = (char *)(*ctx->malloc)((int)__n + 2,ctx->malloc_data);
    if (pcVar7 != (char *)0x0) {
      *pcVar7 = '\"';
      memcpy(pcVar7 + 1,pcVar8,__n);
      pcVar7[__n + 1] = '\"';
      pDVar1 = ctx->file_macro;
      pDVar1->definition = pcVar7;
      return pDVar1;
    }
  }
  ctx->out_of_memory = 1;
  return (Define *)0x0;
}

Assistant:

static const Define *find_define(Context *ctx, const char *sym)
{
    const uint8 hash = hash_define(sym);
    Define *bucket = ctx->define_hashtable[hash];
    while (bucket)
    {
        if (strcmp(bucket->identifier, sym) == 0)
            return bucket;
        bucket = bucket->next;
    } // while

    const uint8 filestrhash = 67;
    assert(hash_define("__FILE__") == filestrhash);

    const uint8 linestrhash = 75;
    assert(hash_define("__LINE__") == linestrhash);

    if ( (hash == filestrhash) && (ctx->file_macro) && (strcmp(sym, "__FILE__") == 0) )
    {
        Free(ctx, (char *) ctx->file_macro->definition);
        const IncludeState *state = ctx->include_stack;
        const char *fname = state ? state->filename : "";
        const size_t len = strlen(fname) + 2;
        char *str = (char *) Malloc(ctx, len);
        if (!str)
            return NULL;
        str[0] = '\"';
        memcpy(str + 1, fname, len - 2);
        str[len - 1] = '\"';
        ctx->file_macro->definition = str;
        return ctx->file_macro;
    } // if

    else if ( (hash == linestrhash) && (ctx->line_macro) && (strcmp(sym, "__LINE__") == 0) )
    {
        Free(ctx, (char *) ctx->line_macro->definition);
        const IncludeState *state = ctx->include_stack;
        const size_t bufsize = 32;
        char *str = (char *) Malloc(ctx, bufsize);
        if (!str)
            return 0;

        const size_t len = snprintf(str, bufsize, "%u", state->line);
        assert(len < bufsize); (void) len;
        ctx->line_macro->definition = str;
        return ctx->line_macro;
    } // else

    return NULL;
}